

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::MessageGenerator::GenerateMessageHeader
          (MessageGenerator *this,Printer *printer)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  FieldDescriptor **__p;
  type ppFVar4;
  FieldGenerator *pFVar5;
  size_type __n;
  FieldDescriptor *pFVar6;
  OneofDescriptor *this_00;
  char *pcVar7;
  reference pvVar8;
  reference this_01;
  pointer pOVar9;
  reference puVar10;
  reference this_02;
  pointer this_03;
  reference this_04;
  pointer pMVar11;
  undefined1 prefer_single_line;
  string *args_1;
  int __c;
  unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
  *generator_4;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
  *__range3_1;
  unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>
  *generator_3;
  iterator __end4_2;
  iterator __begin4_2;
  vector<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>
  *__range4_2;
  unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
  *generator_2;
  iterator __end4_1;
  iterator __begin4_1;
  vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
  *__range4_1;
  int i_2;
  int oneof_index;
  OneofDescriptor *oneof;
  FieldDescriptor *field;
  int i_1;
  vector<char,_std::allocator<char>_> seen_oneofs;
  undefined1 local_f8 [8];
  SourceLocation location;
  string message_comments;
  unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
  *generator_1;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
  *__range3;
  int i;
  unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
  local_40;
  unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
  sorted_fields;
  unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
  *generator;
  iterator __end4;
  iterator __begin4;
  vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
  *__range4;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  bVar1 = IsMapEntryMessage(this->descriptor_);
  if (bVar1) {
    __end4 = std::
             vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
             ::begin(&this->nested_message_generators_);
    generator = (unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
                 *)std::
                   vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
                   ::end(&this->nested_message_generators_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end4,(__normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>_>
                                       *)&generator), bVar1) {
      sorted_fields._M_t.
      super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
      .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>._M_head_impl =
           (__uniq_ptr_data<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>,_true,_true>
            )__gnu_cxx::
             __normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>_>
             ::operator*(&__end4);
      pMVar11 = std::
                unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
                ::operator->((unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
                              *)sorted_fields._M_t.
                                super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                                .
                                super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>
                                ._M_head_impl);
      GenerateMessageHeader(pMVar11,printer);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>_>
      ::operator++(&__end4);
    }
  }
  else {
    args_1 = &this->class_name_;
    io::Printer::Print<char[10],std::__cxx11::string>
              (printer,"#pragma mark - $classname$\n\n",(char (*) [10])0x77c586,args_1);
    iVar2 = Descriptor::field_count(this->descriptor_);
    if (iVar2 != 0) {
      __p = anon_unknown_7::SortFieldsByNumber(this->descriptor_);
      std::
      unique_ptr<google::protobuf::FieldDescriptor_const*[],std::default_delete<google::protobuf::FieldDescriptor_const*[]>>
      ::
      unique_ptr<google::protobuf::FieldDescriptor_const**,std::default_delete<google::protobuf::FieldDescriptor_const*[]>,void,bool>
                ((unique_ptr<google::protobuf::FieldDescriptor_const*[],std::default_delete<google::protobuf::FieldDescriptor_const*[]>>
                  *)&local_40,__p);
      io::Printer::Print<char[10],std::__cxx11::string>
                (printer,"typedef GPB_ENUM($classname$_FieldNumber) {\n",(char (*) [10])0x77c586,
                 &this->class_name_);
      io::Printer::Indent(printer);
      __range3._0_4_ = 0;
      while( true ) {
        uVar3 = Descriptor::field_count(this->descriptor_);
        args_1 = (string *)(ulong)uVar3;
        if ((int)uVar3 <= (int)__range3) break;
        ppFVar4 = std::
                  unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                  ::operator[](&local_40,(long)(int)__range3);
        pFVar5 = FieldGeneratorMap::get(&this->field_generators_,*ppFVar4);
        FieldGenerator::GenerateFieldNumberConstant(pFVar5,printer);
        __range3._0_4_ = (int)__range3 + 1;
      }
      io::Printer::Outdent(printer);
      io::Printer::Print<>(printer,"};\n\n");
      std::
      unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
      ::~unique_ptr(&local_40);
    }
    __end3 = std::
             vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
             ::begin(&this->oneof_generators_);
    generator_1 = (unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
                   *)std::
                     vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
                     ::end(&this->oneof_generators_);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>_>
                                  *)&generator_1);
      prefer_single_line = SUB81(args_1,0);
      if (!bVar1) break;
      puVar10 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>_>
                ::operator*(&__end3);
      pOVar9 = std::
               unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
               ::operator->(puVar10);
      OneofGenerator::GenerateCaseEnum(pOVar9,printer);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>_>
      ::operator++(&__end3);
    }
    std::__cxx11::string::string
              ((string *)
               &location.leading_detached_comments.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    SourceLocation::SourceLocation((SourceLocation *)local_f8);
    bVar1 = Descriptor::GetSourceLocation(this->descriptor_,(SourceLocation *)local_f8);
    if (bVar1) {
      BuildCommentsString_abi_cxx11_
                ((string *)
                 &seen_oneofs.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                 (objectivec *)local_f8,(SourceLocation *)0x0,(bool)prefer_single_line);
      std::__cxx11::string::operator=
                ((string *)
                 &location.leading_detached_comments.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (string *)
                 &seen_oneofs.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
      std::__cxx11::string::~string
                ((string *)
                 &seen_oneofs.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
    }
    else {
      std::__cxx11::string::operator=
                ((string *)
                 &location.leading_detached_comments.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,"");
    }
    io::Printer::
    Print<char[10],std::__cxx11::string,char[21],std::__cxx11::string,char[9],std::__cxx11::string>
              (printer,
               "$comments$$deprecated_attribute$GPB_FINAL @interface $classname$ : GPBMessage\n\n",
               (char (*) [10])0x77c586,&this->class_name_,(char (*) [21])"deprecated_attribute",
               &this->deprecated_attribute_,(char (*) [9])0x7cc1e9,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &location.leading_detached_comments.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __n = std::
          vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
          ::size(&this->oneof_generators_);
    field._7_1_ = 0;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&i_1,__n,
               (value_type_conflict4 *)((long)&field + 7),(allocator_type *)((long)&field + 6));
    std::allocator<char>::~allocator((allocator<char> *)((long)&field + 6));
    for (field._0_4_ = 0; uVar3 = (uint)field, iVar2 = Descriptor::field_count(this->descriptor_),
        (int)uVar3 < iVar2; field._0_4_ = (uint)field + 1) {
      pcVar7 = (char *)(ulong)(uint)field;
      pFVar6 = Descriptor::field(this->descriptor_,(uint)field);
      this_00 = FieldDescriptor::real_containing_oneof(pFVar6);
      if (this_00 != (OneofDescriptor *)0x0) {
        pcVar7 = OneofDescriptor::index(this_00,pcVar7,__c);
        iVar2 = (int)pcVar7;
        pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)&i_1,(long)iVar2);
        if (*pvVar8 == '\0') {
          pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                             ((vector<char,_std::allocator<char>_> *)&i_1,(long)iVar2);
          *pvVar8 = '\x01';
          this_01 = std::
                    vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
                    ::operator[](&this->oneof_generators_,(long)iVar2);
          pOVar9 = std::
                   unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
                   ::operator->(this_01);
          OneofGenerator::GeneratePublicCasePropertyDeclaration(pOVar9,printer);
        }
      }
      pFVar5 = FieldGeneratorMap::get(&this->field_generators_,pFVar6);
      (*pFVar5->_vptr_FieldGenerator[3])(pFVar5,printer);
    }
    io::Printer::Print<>(printer,"@end\n\n");
    for (__range4_1._0_4_ = 0; iVar2 = Descriptor::field_count(this->descriptor_),
        (int)__range4_1 < iVar2; __range4_1._0_4_ = (int)__range4_1 + 1) {
      pFVar6 = Descriptor::field(this->descriptor_,(int)__range4_1);
      pFVar5 = FieldGeneratorMap::get(&this->field_generators_,pFVar6);
      (*pFVar5->_vptr_FieldGenerator[5])(pFVar5,printer);
    }
    bVar1 = std::
            vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
            ::empty(&this->oneof_generators_);
    if (!bVar1) {
      __end4_1 = std::
                 vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
                 ::begin(&this->oneof_generators_);
      generator_2 = (unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
                     *)std::
                       vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
                       ::end(&this->oneof_generators_);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end4_1,
                                (__normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>_>
                                 *)&generator_2), bVar1) {
        puVar10 = __gnu_cxx::
                  __normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>_>
                  ::operator*(&__end4_1);
        pOVar9 = std::
                 unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
                 ::operator->(puVar10);
        OneofGenerator::GenerateClearFunctionDeclaration(pOVar9,printer);
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>_>
        ::operator++(&__end4_1);
      }
      io::Printer::Print<>(printer,"\n");
    }
    iVar2 = Descriptor::extension_count(this->descriptor_);
    if (0 < iVar2) {
      io::Printer::Print<char[10],std::__cxx11::string>
                (printer,"@interface $classname$ (DynamicMethods)\n\n",(char (*) [10])0x77c586,
                 &this->class_name_);
      __end4_2 = std::
                 vector<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>
                 ::begin(&this->extension_generators_);
      generator_3 = (unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>
                     *)std::
                       vector<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>
                       ::end(&this->extension_generators_);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end4_2,
                                (__normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>_>
                                 *)&generator_3), bVar1) {
        this_02 = __gnu_cxx::
                  __normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>_>
                  ::operator*(&__end4_2);
        this_03 = std::
                  unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>
                  ::operator->(this_02);
        ExtensionGenerator::GenerateMembersHeader(this_03,printer);
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>_>
        ::operator++(&__end4_2);
      }
      io::Printer::Print<>(printer,"@end\n\n");
    }
    __end3_1 = std::
               vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
               ::begin(&this->nested_message_generators_);
    generator_4 = (unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
                   *)std::
                     vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
                     ::end(&this->nested_message_generators_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3_1,
                              (__normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>_>
                               *)&generator_4), bVar1) {
      this_04 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>_>
                ::operator*(&__end3_1);
      pMVar11 = std::
                unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
                ::operator->(this_04);
      GenerateMessageHeader(pMVar11,printer);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>_>
      ::operator++(&__end3_1);
    }
    std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)&i_1);
    SourceLocation::~SourceLocation((SourceLocation *)local_f8);
    std::__cxx11::string::~string
              ((string *)
               &location.leading_detached_comments.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateMessageHeader(io::Printer* printer) {
  // This a a map entry message, just recurse and do nothing directly.
  if (IsMapEntryMessage(descriptor_)) {
    for (const auto& generator : nested_message_generators_) {
      generator->GenerateMessageHeader(printer);
    }
    return;
  }

  printer->Print(
      "#pragma mark - $classname$\n"
      "\n",
      "classname", class_name_);

  if (descriptor_->field_count()) {
    std::unique_ptr<const FieldDescriptor*[]> sorted_fields(
        SortFieldsByNumber(descriptor_));

    printer->Print("typedef GPB_ENUM($classname$_FieldNumber) {\n",
                   "classname", class_name_);
    printer->Indent();

    for (int i = 0; i < descriptor_->field_count(); i++) {
      field_generators_.get(sorted_fields[i])
          .GenerateFieldNumberConstant(printer);
    }

    printer->Outdent();
    printer->Print("};\n\n");
  }

  for (const auto& generator : oneof_generators_) {
    generator->GenerateCaseEnum(printer);
  }

  std::string message_comments;
  SourceLocation location;
  if (descriptor_->GetSourceLocation(&location)) {
    message_comments = BuildCommentsString(location, false);
  } else {
    message_comments = "";
  }

  printer->Print(
      "$comments$$deprecated_attribute$GPB_FINAL @interface $classname$ : GPBMessage\n\n",
      "classname", class_name_,
      "deprecated_attribute", deprecated_attribute_,
      "comments", message_comments);

  std::vector<char> seen_oneofs(oneof_generators_.size(), 0);
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    const OneofDescriptor* oneof = field->real_containing_oneof();
    if (oneof) {
      const int oneof_index = oneof->index();
      if (!seen_oneofs[oneof_index]) {
        seen_oneofs[oneof_index] = 1;
        oneof_generators_[oneof_index]->GeneratePublicCasePropertyDeclaration(
            printer);
      }
    }
    field_generators_.get(field).GeneratePropertyDeclaration(printer);
  }

  printer->Print("@end\n\n");

  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i))
        .GenerateCFunctionDeclarations(printer);
  }

  if (!oneof_generators_.empty()) {
    for (const auto& generator : oneof_generators_) {
      generator->GenerateClearFunctionDeclaration(printer);
    }
    printer->Print("\n");
  }

  if (descriptor_->extension_count() > 0) {
    printer->Print("@interface $classname$ (DynamicMethods)\n\n",
                   "classname", class_name_);
    for (const auto& generator : extension_generators_) {
      generator->GenerateMembersHeader(printer);
    }
    printer->Print("@end\n\n");
  }

  for (const auto& generator : nested_message_generators_) {
    generator->GenerateMessageHeader(printer);
  }
}